

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::stopReadInLoop(TcpConnection *this)

{
  bool bVar1;
  pointer pCVar2;
  TcpConnection *this_local;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if ((this->m_reading & 1U) == 0) {
    pCVar2 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_channel);
    bVar1 = Channel::isReading(pCVar2);
    if (!bVar1) {
      return;
    }
  }
  pCVar2 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  Channel::disableReading(pCVar2);
  this->m_reading = false;
  return;
}

Assistant:

void TcpConnection::stopReadInLoop()
{
	m_loop->assertInLoopThread();
	if (m_reading || m_channel->isReading())
	{
		m_channel->disableReading();
		m_reading = false;
	}
}